

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O3

int XMLDoc_free(XMLDoc *doc)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 0;
  if ((doc != (XMLDoc *)0x0) && (iVar1 = 0, doc->init_value == 0x19770522)) {
    if (0 < doc->n_nodes) {
      lVar2 = 0;
      do {
        XMLNode_free(doc->nodes[lVar2]);
        free(doc->nodes[lVar2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 < doc->n_nodes);
    }
    free(doc->nodes);
    doc->nodes = (XMLNode **)0x0;
    doc->n_nodes = 0;
    doc->i_root = -1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int XMLDoc_free(XMLDoc* doc)
{
	int i;
	
	if (doc == NULL || doc->init_value != XML_INIT_DONE)
		return FALSE;

	for (i = 0; i < doc->n_nodes; i++) {
		(void)XMLNode_free(doc->nodes[i]);
		__free(doc->nodes[i]);
	}
	__free(doc->nodes);
	doc->nodes = NULL;
	doc->n_nodes = 0;
	doc->i_root = -1;

	return TRUE;
}